

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  bool bVar1;
  ImGuiViewportP **ppIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiViewportP *viewport_1;
  int n_3;
  ImU32 in_stack_00000078;
  ImU32 in_stack_0000007c;
  ImGuiMouseCursor in_stack_00000080;
  float in_stack_00000084;
  ImDrawList *in_stack_00000088;
  ImVec2 in_stack_00000090;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImRect mouse_cursor_rect;
  int n_2;
  ImGuiWindow *window;
  int n_1;
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiViewportP *viewport;
  int n;
  ImGuiContext *g;
  ImDrawList *in_stack_fffffffffffffed8;
  _func_void_ImDrawData_ptr *p_Var4;
  ImGuiWindow *in_stack_fffffffffffffee0;
  ImVector<ImDrawList_*> *out_list;
  ImVector<ImDrawList_*> *in_stack_fffffffffffffee8;
  ImGuiViewportP *in_stack_fffffffffffffef0;
  ImVec2 *in_stack_ffffffffffffff00;
  ImVec2 *local_f8;
  ImGuiWindow *local_f0;
  ImGuiWindow *local_e8;
  ImRect local_d0;
  ImGuiViewportP *local_c0;
  int local_b4;
  ImVector<ImDrawList_*> local_b0;
  ImVec2 in_stack_ffffffffffffff60;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 in_stack_ffffffffffffff78;
  ImGuiMouseCursor in_stack_ffffffffffffff84;
  ImFontAtlas *in_stack_ffffffffffffff88;
  ImVec2 IStack_68;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImRect local_4c;
  int local_3c;
  ImGuiWindow *local_38;
  int local_2c;
  ImGuiWindow *local_28 [2];
  ImGuiViewportP *local_18;
  int local_c;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  (local_8->IO).MetricsRenderIndices = 0;
  (local_8->IO).MetricsRenderVertices = 0;
  for (local_c = 0; local_c != (local_8->Viewports).Size; local_c = local_c + 1) {
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_c);
    local_18 = *ppIVar2;
    ImDrawDataBuilder::Clear((ImDrawDataBuilder *)in_stack_fffffffffffffee0);
    if (local_18->DrawLists[0] != (ImDrawList *)0x0) {
      GetBackgroundDrawList((ImGuiViewport *)0x1b4ffd);
      AddDrawListToDrawData
                ((ImVector<ImDrawList_*> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
  }
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    local_e8 = (ImGuiWindow *)0x0;
  }
  else {
    local_e8 = local_8->NavWindowingTarget->RootWindow;
  }
  local_28[0] = local_e8;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_f0 = (ImGuiWindow *)0x0;
  }
  else {
    local_f0 = local_8->NavWindowingList;
  }
  local_28[1] = local_f0;
  for (local_2c = 0; local_2c != (local_8->Windows).Size; local_2c = local_2c + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_2c);
    local_38 = *ppIVar3;
    bVar1 = IsWindowActiveAndVisible(local_38);
    if ((((bVar1) && ((local_38->Flags & 0x1000000U) == 0)) && (local_38 != local_28[0])) &&
       (local_38 != local_28[1])) {
      AddRootWindowToDrawData(in_stack_fffffffffffffee0);
    }
  }
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    if ((local_28[local_3c] != (ImGuiWindow *)0x0) &&
       (bVar1 = IsWindowActiveAndVisible(local_28[local_3c]), bVar1)) {
      AddRootWindowToDrawData(in_stack_fffffffffffffee0);
    }
  }
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffee0);
  if ((((local_8->IO).MouseDrawCursor & 1U) != 0) && (local_8->MouseCursor != -1)) {
    ImVec2::ImVec2(&local_54);
    ImVec2::ImVec2(&local_5c);
    local_f8 = (ImVec2 *)&stack0xffffffffffffff78;
    in_stack_ffffffffffffff00 = &IStack_68;
    do {
      ImVec2::ImVec2(local_f8);
      local_f8 = local_f8 + 1;
    } while (local_f8 != in_stack_ffffffffffffff00);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                       (ImVec2 *)in_stack_ffffffffffffff78,(ImVec2 *)in_stack_ffffffffffffff70,
                       (ImVec2 *)in_stack_ffffffffffffff68,(ImVec2 *)in_stack_ffffffffffffff60);
    if (bVar1) {
      in_stack_fffffffffffffef0 = (ImGuiViewportP *)&(local_8->IO).MousePos;
      in_stack_fffffffffffffee8 = &local_b0;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffee8,local_5c.x + 2.0,local_5c.y + 2.0);
      local_b0.Data = (ImDrawList **)::operator*((ImVec2 *)in_stack_fffffffffffffed8,0.0);
      ::operator+((ImVec2 *)in_stack_fffffffffffffed8,(ImVec2 *)0x1b5344);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffff68,(ImVec2 *)in_stack_fffffffffffffef0,
                     (ImVec2 *)&stack0xffffffffffffff60);
    }
  }
  (local_8->IO).MetricsRenderIndices = 0;
  (local_8->IO).MetricsRenderVertices = 0;
  for (local_b4 = 0; local_b4 < (local_8->Viewports).Size; local_b4 = local_b4 + 1) {
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_b4);
    local_c0 = *ppIVar2;
    ImDrawDataBuilder::FlattenIntoSingleLayer((ImDrawDataBuilder *)in_stack_ffffffffffffff00);
    local_d0 = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1b5408);
    bVar1 = ImRect::Overlaps(&local_d0,&local_4c);
    if (bVar1) {
      GetForegroundDrawList((ImGuiViewport *)0x1b5436);
      RenderMouseCursor(in_stack_00000088,in_stack_00000090,in_stack_00000084,in_stack_00000080,
                        in_stack_0000007c,in_stack_00000078,n_3);
    }
    if (local_c0->DrawLists[1] != (ImDrawList *)0x0) {
      out_list = (local_c0->DrawDataBuilder).Layers;
      GetForegroundDrawList((ImGuiViewport *)0x1b54a7);
      AddDrawListToDrawData(out_list,in_stack_fffffffffffffed8);
    }
    SetupViewportDrawData(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    (local_8->IO).MetricsRenderVertices =
         ((local_c0->super_ImGuiViewport).DrawData)->TotalVtxCount +
         (local_8->IO).MetricsRenderVertices;
    (local_8->IO).MetricsRenderIndices =
         ((local_c0->super_ImGuiViewport).DrawData)->TotalIdxCount +
         (local_8->IO).MetricsRenderIndices;
  }
  ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,0);
  if ((0 < (((*ppIVar2)->super_ImGuiViewport).DrawData)->CmdListsCount) &&
     ((local_8->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
    p_Var4 = (local_8->IO).RenderDrawListsFn;
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,0);
    (*p_Var4)(((*ppIVar2)->super_ImGuiViewport).DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render (for each active window)
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingList : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the tp-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested
    ImRect mouse_cursor_rect;
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
    {
        ImVec2 offset, size, uv[4];
        if (g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
            mouse_cursor_rect = ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(size.x + 2, size.y + 2) * g.Style.MouseCursorScale);
    }

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        if (viewport->GetRect().Overlaps(mouse_cursor_rect))
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        g.IO.MetricsRenderVertices += viewport->DrawData->TotalVtxCount;
        g.IO.MetricsRenderIndices += viewport->DrawData->TotalIdxCount;
    }

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.Viewports[0]->DrawData->CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(g.Viewports[0]->DrawData);
#endif
}